

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_dof.h
# Opt level: O0

void lf::assemble::
     FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>
               (anon_class_32_4_e2ee8f54 *selectvals,COOMatrix<double> *A,
               Matrix<double,__1,_1,_0,__1,_1> *b)

{
  Index IVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  Scalar *pSVar5;
  Scalar SVar6;
  pair<bool,_double> pVar7;
  pair<bool,_double> selval_2;
  gdof_idx_t dofnum;
  undefined1 local_558;
  pair<bool,_double> selval_1;
  gdof_idx_t k_1;
  pair<bool,_double> selval;
  gdof_idx_t k;
  Matrix<double,__1,_1,_0,__1,_1> tmp_vec;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  stringstream local_430 [8];
  stringstream ss_1;
  ostream local_420 [383];
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  uint local_24;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pEStack_20;
  size_type N;
  Matrix<double,__1,_1,_0,__1,_1> *b_local;
  COOMatrix<double> *A_local;
  anon_class_32_4_e2ee8f54 *selectvals_local;
  
  pEStack_20 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)b;
  b_local = (Matrix<double,__1,_1,_0,__1,_1> *)A;
  A_local = (COOMatrix<double> *)selectvals;
  IVar1 = COOMatrix<double>::cols(A);
  local_24 = (uint)IVar1;
  uVar2 = COOMatrix<double>::rows((COOMatrix<double> *)b_local);
  if (uVar2 != local_24) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(local_1a0,"Matrix must be square!");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"A.rows() == N",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,&local_209);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e0,&local_208,0x5a,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"false",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"",&local_2a1);
    lf::base::AssertionFailed(&local_250,&local_278,0x5a,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    abort();
  }
  uVar2 = (ulong)local_24;
  uVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(pEStack_20);
  if (uVar2 != uVar3) {
    std::__cxx11::stringstream::stringstream(local_430);
    poVar4 = std::operator<<(local_420,"Mismatch N = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_24);
    poVar4 = std::operator<<(poVar4," <-> b.size() = ");
    IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(pEStack_20);
    std::ostream::operator<<(poVar4,IVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"N == b.size()",&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,&local_479);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_450,&local_478,0x5c,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"false",&local_4c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,&local_4e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"",
               (allocator<char> *)
               ((long)&tmp_vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows + 7));
    lf::base::AssertionFailed(&local_4c0,&local_4e8,0x5c,&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tmp_vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows + 7));
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    abort();
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&k,&local_24);
  for (selval.second = 0.0; (long)selval.second < (long)(ulong)local_24;
      selval.second = (double)((long)selval.second + 1)) {
    pVar7 = solvePoisson::anon_class_32_4_e2ee8f54::operator()
                      ((anon_class_32_4_e2ee8f54 *)A_local,selval.second._0_4_);
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&k,
                          (Index)selval.second);
      *pSVar5 = 0.0;
    }
    else {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&k,
                          (Index)selval.second);
      *pSVar5 = pVar7.second;
    }
  }
  COOMatrix<double>::MatVecMult<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            ((COOMatrix<double> *)b_local,-1.0,(Matrix<double,__1,_1,_0,__1,_1> *)&k,
             (Matrix<double,__1,_1,_0,__1,_1> *)pEStack_20);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&k);
  for (selval_1.second = 0.0; (long)selval_1.second < (long)(ulong)local_24;
      selval_1.second = (double)((long)selval_1.second + 1)) {
    pVar7 = solvePoisson::anon_class_32_4_e2ee8f54::operator()
                      ((anon_class_32_4_e2ee8f54 *)A_local,SUB84(selval_1.second,0));
    SVar6 = pVar7.second;
    local_558 = pVar7.first;
    selval_1._0_8_ = SVar6;
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pEStack_20,
                          (Index)selval_1.second);
      *pSVar5 = SVar6;
    }
  }
  dofnum = (gdof_idx_t)A_local;
  COOMatrix<double>::
  setZero<lf::assemble::FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>(solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>
            ((COOMatrix<double> *)b_local,(anon_class_8_1_3ad3be2c_for_pred *)&dofnum);
  for (selval_2.second = 0.0; (long)selval_2.second < (long)(ulong)local_24;
      selval_2.second = (double)((long)selval_2.second + 1)) {
    pVar7 = solvePoisson::anon_class_32_4_e2ee8f54::operator()
                      ((anon_class_32_4_e2ee8f54 *)A_local,SUB84(selval_2.second,0));
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      COOMatrix<double>::AddToEntry
                ((COOMatrix<double> *)b_local,(gdof_idx_t)selval_2.second,
                 (gdof_idx_t)selval_2.second,1.0);
    }
  }
  return;
}

Assistant:

void FixFlaggedSolutionComponents(SELECTOR &&selectvals, COOMatrix<SCALAR> &A,
                                  RHSVECTOR &b) {
  const lf::assemble::size_type N(A.cols());
  LF_ASSERT_MSG(A.rows() == N, "Matrix must be square!");
  LF_ASSERT_MSG(N == b.size(),
                "Mismatch N = " << N << " <-> b.size() = " << b.size());
  {
    // Multiply sparse matrix with the vector of fixed components and subtract
    // result from right hand side
    // To skip irrelevant components of fixed_vec rely on a temporary vector
    Eigen::Matrix<SCALAR, Eigen::Dynamic, 1> tmp_vec(N);
    for (lf::assemble::gdof_idx_t k = 0; k < N; ++k) {
      const auto selval{selectvals(k)};
      if (selval.first) {
        tmp_vec[k] = selval.second;
      } else {
        tmp_vec[k] = SCALAR();
      }
    }
    A.MatVecMult(-1.0, tmp_vec, b);
  }
  // Set vector components of right-hand-side vector for prescribed values
  for (lf::assemble::gdof_idx_t k = 0; k < N; ++k) {
    const auto selval{selectvals(k)};
    if (selval.first) {
      b[k] = selval.second;
    }
  }
  // Set rows and columns of the sparse matrix corresponding to the fixed
  // solution components to zero
  A.setZero([&selectvals](gdof_idx_t i, gdof_idx_t j) {
    return (selectvals(i).first || selectvals(j).first);
  });
  // Old implementation, demonstrating what is going on
  // lf::assemble::COOMatrix<double>::TripletVec::iterator new_last =
  //     std::remove_if(
  //         A.triplets().begin(), A.triplets().end(),
  //         [&fixed_comp_flags](
  //             typename lf::assemble::COOMatrix<double>::Triplet &triplet) {
  //           return (fixed_comp_flags[triplet.row()] ||
  //                   fixed_comp_flags[triplet.col()]);
  //         });
  // // Adjust size of triplet vector
  // A.triplets().erase(new_last, A.triplets().end());
  // Add Unit diagonal entries corrresponding to fixed components
  for (lf::assemble::gdof_idx_t dofnum = 0; dofnum < N; ++dofnum) {
    const auto selval{selectvals(dofnum)};
    if (selval.first) {
      A.AddToEntry(dofnum, dofnum, 1.0);
    }
  }
}